

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte *pbVar1;
  MMFWEntryName *pacVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  MMFW *mmfw;
  char *pcVar6;
  int *piVar7;
  MMFWEntry *pMVar8;
  FILE *__s;
  uint8_t *__ptr;
  ulong uVar9;
  ulong uVar10;
  LPStatus status;
  MMFW *local_38;
  
  progname = *argv;
  while( true ) {
    while( true ) {
      while (iVar3 = LPGetopt(argc,argv,"ahn:tvx"), 0x73 < iVar3) {
        if (iVar3 == 0x74) {
          mode = MMFW_TOOL_MODE_LIST;
        }
        else if (iVar3 == 0x76) {
          verbose = '\x01';
        }
        else {
          if (iVar3 != 0x78) goto LAB_001024e7;
          mode = MMFW_TOOL_MODE_EXTRACT;
        }
      }
      if (0x67 < iVar3) break;
      if (iVar3 != 0x61) {
        if ((((iVar3 == -1) && (mode != MMFW_TOOL_MODE_NONE)) && (_optind < argc)) &&
           ((mode != MMFW_TOOL_MODE_EXTRACT ||
            (((want_extract_all != '\x01' || (which_member < 0)) &&
             ((want_extract_all != '\0' || (-1 < which_member)))))))) {
          mmfw = MMFW_NewFromFile(argv[_optind],&status);
          if (status == LUNAPURPURA_OK) {
            pcVar6 = MMFW_KindString(mmfw);
            uVar9 = 0;
            LPLog("mmfw","\"%s\" MMFW archive with %d members",pcVar6,(ulong)mmfw->n_entries);
            if (mode == MMFW_TOOL_MODE_EXTRACT) {
              if (want_extract_all == '\0') {
                uVar9 = (ulong)(uint)which_member;
              }
              if (want_extract_all == '\x01') {
                uVar4 = (uint)mmfw->n_entries;
              }
              else {
                uVar4 = which_member + 1;
              }
            }
            else {
              uVar4 = 0;
              if (mode == MMFW_TOOL_MODE_LIST) {
                uVar4 = (uint)mmfw->n_entries;
                uVar9 = 0;
              }
            }
            if ((ushort)uVar9 < (ushort)uVar4) {
              uVar9 = uVar9 & 0xffff;
              uVar10 = (ulong)(uint)((int)uVar9 << 5);
              local_38 = mmfw;
              do {
                if (mode == MMFW_TOOL_MODE_EXTRACT) {
                  pMVar8 = MMFW_EntryAtIndex(mmfw,(int)uVar9);
                  __s = fopen(*mmfw->names + uVar10,"wb");
                  __ptr = MMFW_EntryData(pMVar8);
                  uVar5 = MMFW_EntryLength(pMVar8);
                  mmfw = local_38;
                  fwrite(__ptr,1,(ulong)uVar5,__s);
                  fclose(__s);
                  MMFW_FreeEntry(pMVar8);
                  if (verbose == '\x01') {
                    fprintf(_stderr,"x\t%s\n",*mmfw->names + uVar10);
                  }
                }
                else if (mode == MMFW_TOOL_MODE_LIST) {
                  pMVar8 = MMFW_EntryAtIndex(mmfw,(int)uVar9);
                  if (pMVar8->kind == MMFW_KIND_SOUNDS) {
                    pbVar1 = ((pMVar8->entry).sound)->unknown;
                    pacVar2 = mmfw->names;
                    pcVar6 = MMFWSoundEntryFormat_String(((pMVar8->entry).sound)->fmt);
                    printf("%d\t%-32s\t%s\t(%d,%d,%d,%d)\t%u\n",uVar9 & 0xffffffff,*pacVar2 + uVar10
                           ,pcVar6,(ulong)*pbVar1,(ulong)pbVar1[1],(ulong)pbVar1[2],(ulong)pbVar1[3]
                           ,(ulong)mmfw->offsets[uVar9]);
                  }
                  else {
                    printf("%d\t%-32s\t%u\n",uVar9 & 0xffffffff,*mmfw->names + uVar10,
                           (ulong)mmfw->offsets[uVar9]);
                  }
                }
                uVar9 = uVar9 + 1;
                uVar10 = uVar10 + 0x20;
              } while ((uVar4 & 0xffff) != uVar9);
            }
            iVar3 = 0;
          }
          else {
            pcVar6 = LPStatusString(status);
            LPWarn("mmfw","couldn\'t read mmfw: %s",pcVar6);
            iVar3 = 1;
            if (status == LUNAPURPURA_CANTOPENFILE) {
              piVar7 = __errno_location();
              pcVar6 = strerror(*piVar7);
              LPWarn("mmfw","%s",pcVar6);
            }
          }
          MMFW_Close(mmfw);
          return iVar3;
        }
        goto LAB_001024e7;
      }
      want_extract_all = '\x01';
    }
    if (iVar3 != 0x6e) break;
    which_member = atoi(_optarg);
  }
  if (iVar3 == 0x68) {
    LPLog("mmfw",
          "usage: %s [options ...] [file]\n\t%s -t <file>                List archive members\n\t%s -x [-v] -a <file>        Extract all members\n\t%s -x [-v] -n <id> <file>   Extract a single member"
          ,progname,progname,progname,progname);
    return 0;
  }
LAB_001024e7:
  LPLog("mmfw",
        "usage: %s [options ...] [file]\n\t%s -t <file>                List archive members\n\t%s -x [-v] -a <file>        Extract all members\n\t%s -x [-v] -n <id> <file>   Extract a single member"
        ,progname,progname,progname,progname);
  return 1;
}

Assistant:

int
main(int argc, char *argv[])
{
#ifdef LUNAPURPURA_HAVE_GETPROGNAME
	progname = (char *)getprogname();
#else
	progname = argv[0];
#endif

	int ch;

	while ((ch = LPGetopt(argc, argv, "ahn:tvx")) != -1) {
		switch (ch) {
		case 'a':
			want_extract_all = true;
			break;
		case 'h':
			usage();
			return EXIT_SUCCESS;
			break;
		case 'n':
			which_member = atoi(optarg);
			break;
		case 't':
			mode = MMFW_TOOL_MODE_LIST;
			break;
		case 'x':
			mode = MMFW_TOOL_MODE_EXTRACT;
			break;
		case 'v':
			verbose = true;
			break;
		case '?': /* FALLTHROUGH */
		default:
			usage();
			return EXIT_FAILURE;
		}
	}
	argc -= optind;
	argv += optind;

	if (mode == MMFW_TOOL_MODE_NONE) {
		usage();
		return EXIT_FAILURE;
	}

	if (argc < 1) {
		usage();
		return EXIT_FAILURE;
	}

	if ((mode == MMFW_TOOL_MODE_EXTRACT) && want_extract_all && which_member >= 0) {
		usage();
		return EXIT_FAILURE;
	}

	if ((mode == MMFW_TOOL_MODE_EXTRACT) && !want_extract_all && (which_member < 0)) {
		usage();
		return EXIT_FAILURE;
	}

	const char *path = argv[0];
	LPStatus status;
	MMFW *mmfw = MMFW_NewFromFile(path, &status);

	if (status != LUNAPURPURA_OK) {
		LPWarn(LP_SUBSYSTEM_MMFW, "couldn't read mmfw: %s", LPStatusString(status));
		if (status == LUNAPURPURA_CANTOPENFILE) {
			LPWarn(LP_SUBSYSTEM_MMFW, "%s", strerror(errno));
		}
		goto fail;
	}

	LPLog(
		LP_SUBSYSTEM_MMFW, "\"%s\" MMFW archive with %d members",
		MMFW_KindString(mmfw), mmfw->n_entries
	);

	uint16_t min_i = 0;
	uint16_t max_i = 0;

	switch (mode) {
	case MMFW_TOOL_MODE_LIST:
		min_i = 0;
		max_i = mmfw->n_entries;
		break;
	case MMFW_TOOL_MODE_EXTRACT:
		min_i = want_extract_all ? 0 : which_member;
		max_i = want_extract_all ? mmfw->n_entries : which_member+1;
		break;
	default:
		; /* NOTREACHED */
	}

	for (uint16_t i = min_i; i < max_i; i++) {
		switch (mode) {
		case MMFW_TOOL_MODE_LIST:
			{
				MMFWEntry *entry = MMFW_EntryAtIndex(mmfw, i);
				switch (entry->kind) {
				case MMFW_KIND_SOUNDS:
					{
						uint8_t *unknown = entry->entry.sound->unknown;
						printf(
							"%d\t%-32s\t%s\t(%d,%d,%d,%d)\t%u\n",
							i,
							mmfw->names[i],
							MMFWSoundEntryFormat_String(entry->entry.sound->fmt),
							unknown[0], unknown[1], unknown[2], unknown[3],
							mmfw->offsets[i]
						);
					}
					break;
				default:
					printf("%d\t%-32s\t%u\n", i, mmfw->names[i], mmfw->offsets[i]);
				}
			}
			break;
		case MMFW_TOOL_MODE_EXTRACT:
			{
				MMFWEntry *entry = MMFW_EntryAtIndex(mmfw, i);
				FILE *outf = fopen(mmfw->names[i], "wb");
				fwrite(MMFW_EntryData(entry), 1, MMFW_EntryLength(entry), outf);
				fclose(outf);
				MMFW_FreeEntry(entry);
				if (verbose) {
					fprintf(stderr, "x\t%s\n", mmfw->names[i]);
				}
			}
			break;
		default:
			; /* NOTREACHED */
		}
	}

	MMFW_Close(mmfw);
	return EXIT_SUCCESS;

fail:
	MMFW_Close(mmfw);
	return EXIT_FAILURE;
}